

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O0

void x509_name_ex_free(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  ASN1_VALUE *orig_ptr;
  X509_NAME *a;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  
  if ((pval != (ASN1_VALUE **)0x0) && (*pval != (ASN1_VALUE *)0x0)) {
    orig_ptr = *pval;
    BUF_MEM_free(*(BUF_MEM **)(orig_ptr + 0x10));
    sk_X509_NAME_ENTRY_pop_free(*(stack_st_X509_NAME_ENTRY **)orig_ptr,X509_NAME_ENTRY_free);
    if (*(long *)(orig_ptr + 0x18) != 0) {
      OPENSSL_free(*(void **)(orig_ptr + 0x18));
    }
    OPENSSL_free(orig_ptr);
    *pval = (ASN1_VALUE *)0x0;
  }
  return;
}

Assistant:

static void x509_name_ex_free(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  X509_NAME *a;
  if (!pval || !*pval) {
    return;
  }
  a = (X509_NAME *)*pval;

  BUF_MEM_free(a->bytes);
  sk_X509_NAME_ENTRY_pop_free(a->entries, X509_NAME_ENTRY_free);
  if (a->canon_enc) {
    OPENSSL_free(a->canon_enc);
  }
  OPENSSL_free(a);
  *pval = NULL;
}